

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O1

int cmExecuteCommand(void *arg,char *name,int numArgs,char **args)

{
  bool bVar1;
  ulong uVar2;
  cmExecutionStatus status;
  cmListFileFunction lff;
  int local_b4;
  string local_b0;
  undefined1 local_90 [72];
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> vStack_48;
  
  local_90._0_8_ = local_90 + 0x10;
  local_90._8_8_ = 0;
  local_90[0x10] = '\0';
  local_90._32_8_ = local_90 + 0x30;
  local_90._40_8_ = 0;
  local_90[0x30] = '\0';
  local_90._64_8_ = 0;
  vStack_48.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_48.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_48.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,name,(allocator<char> *)&local_b4);
  cmCommandContext::cmCommandName::operator=((cmCommandName *)local_90,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_b0._M_dataplus._M_p._4_4_,local_b0._M_dataplus._M_p._0_4_) !=
      &local_b0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_b0._M_dataplus._M_p._4_4_,local_b0._M_dataplus._M_p._0_4_),
                    local_b0.field_2._M_allocated_capacity + 1);
  }
  if (0 < numArgs) {
    uVar2 = (ulong)(uint)numArgs;
    do {
      local_b0._M_dataplus._M_p._0_4_ = 1;
      local_b4 = 0;
      std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
      emplace_back<char_const*&,cmListFileArgument::Delimiter,int>
                ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)&vStack_48,args,
                 (Delimiter *)&local_b0,&local_b4);
      args = args + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  local_b0._M_dataplus._M_p._0_4_ = 0;
  bVar1 = cmMakefile::ExecuteCommand
                    ((cmMakefile *)arg,(cmListFileFunction *)local_90,(cmExecutionStatus *)&local_b0
                    );
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&vStack_48);
  if ((undefined1 *)local_90._32_8_ != local_90 + 0x30) {
    operator_delete((void *)local_90._32_8_,CONCAT71(local_90._49_7_,local_90[0x30]) + 1);
  }
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_,CONCAT71(local_90._17_7_,local_90[0x10]) + 1);
  }
  return (int)bVar1;
}

Assistant:

int CCONV cmExecuteCommand(void* arg, const char* name, int numArgs,
                           const char** args)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  cmListFileFunction lff;
  lff.Name = name;
  for (int i = 0; i < numArgs; ++i) {
    // Assume all arguments are quoted.
    lff.Arguments.emplace_back(args[i], cmListFileArgument::Quoted, 0);
  }
  cmExecutionStatus status;
  return mf->ExecuteCommand(lff, status);
}